

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

combinator * parser::memoize<hwl::ControlFlow>(ind id,ControlFlow *psVal,combinator *f)

{
  anon_class_48_3_83fa9d98 *in_RDI;
  anon_class_48_3_83fa9d98 *__f;
  function<bool_(parser::state_&)> *in_stack_ffffffffffffffa0;
  
  __f = in_RDI;
  std::function<bool_(parser::state_&)>::function
            (in_stack_ffffffffffffffa0,(function<bool_(parser::state_&)> *)in_RDI);
  std::function<bool(parser::state&)>::
  function<parser::memoize<hwl::ControlFlow>(unsigned_long,hwl::ControlFlow&,std::function<bool(parser::state&)>const&)::_lambda(parser::state&)_1_,void>
            (in_stack_ffffffffffffffa0,__f);
  memoize<hwl::ControlFlow>(unsigned_long,hwl::ControlFlow&,std::function<bool(parser::state&)>const&)
  ::{lambda(parser::state&)#1}::~function((anon_class_48_3_83fa9d98 *)0x12fe53);
  return (combinator *)in_RDI;
}

Assistant:

combinator memoize(ind id, T& psVal, const combinator& f) {
		return [id,&psVal,f](state& ps) {
			memo m;
			if ( ps.memo(id, m) ) {
				if ( m.success ) {
					m.result.bind(psVal);
					ps.set_posn(m.end);
				}
			} else {
				posn psStart = ps.posn();
				m.success = f(ps);
				m.end = ps.posn();
				if ( m.success ) m.result = psVal;
				ps.set_memo(psStart, id, m);
			}
			return m.success;
		};
	}